

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUserDefinedIO.cpp
# Opt level: O0

TestInstance * __thiscall
vkt::tessellation::anon_unknown_1::UserDefinedIOTest::createInstance
          (UserDefinedIOTest *this,Context *context)

{
  Context *context_00;
  UserDefinedIOTestInstance *this_00;
  CaseDefinition local_48;
  Context *local_18;
  Context *context_local;
  UserDefinedIOTest *this_local;
  
  local_18 = context;
  context_local = (Context *)this;
  this_00 = (UserDefinedIOTestInstance *)operator_new(0x58);
  context_00 = local_18;
  CaseDefinition::CaseDefinition(&local_48,&this->m_caseDef);
  UserDefinedIOTestInstance::UserDefinedIOTestInstance
            (this_00,context_00,&local_48,&this->m_tesInputs);
  CaseDefinition::~CaseDefinition(&local_48);
  return &this_00->super_TestInstance;
}

Assistant:

TestInstance* UserDefinedIOTest::createInstance (Context& context) const
{
	return new UserDefinedIOTestInstance(context, m_caseDef, m_tesInputs);
}